

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::LazyDescriptor::Once(LazyDescriptor *this,ServiceDescriptor *service)

{
  anon_class_16_2_d159f980 local_28;
  ServiceDescriptor *local_18;
  ServiceDescriptor *service_local;
  LazyDescriptor *this_local;
  
  if (this->once_ != (once_flag *)0x0) {
    local_28.service = &local_18;
    local_28.this = this;
    local_18 = service;
    service_local = (ServiceDescriptor *)this;
    absl::lts_20250127::
    call_once<google::protobuf::internal::LazyDescriptor::Once(google::protobuf::ServiceDescriptor_const*)::__0>
              (this->once_,&local_28);
  }
  return;
}

Assistant:

void LazyDescriptor::Once(const ServiceDescriptor* service) {
  if (once_) {
    absl::call_once(*once_, [&] {
      auto* file = service->file();
      ABSL_CHECK(file->finished_building_);
      const char* lazy_name = reinterpret_cast<const char*>(once_ + 1);
      descriptor_ =
          file->pool_->CrossLinkOnDemandHelper(lazy_name, false).descriptor();
    });
  }
}